

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O2

void __thiscall QGraphicsDropShadowEffect::draw(QGraphicsDropShadowEffect *this,QPainter *painter)

{
  long lVar1;
  char cVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  byte bVar6;
  qreal qVar7;
  QPointF QVar8;
  double local_f8;
  double dStack_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined2 local_80;
  undefined8 local_78 [10];
  long local_28;
  
  bVar6 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  qVar7 = QPixmapDropShadowFilter::blurRadius(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
  if (qVar7 <= 0.0) {
    QVar8 = QPixmapDropShadowFilter::offset(*(QPixmapDropShadowFilter **)(lVar1 + 0xa8));
    if ((QVar8.xp == 0.0) && (!NAN(QVar8.xp))) {
      if ((QVar8.yp == 0.0) && (!NAN(QVar8.yp))) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QGraphicsEffect::drawSource(&this->super_QGraphicsEffect,painter);
          return;
        }
        goto LAB_00375043;
      }
    }
  }
  local_d0 = 0;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QGraphicsEffect::sourcePixmap
            ((QGraphicsEffect *)local_e8,(CoordinateSystem)this,(QPoint *)0x0,
             (PixmapPadMode)&local_d0);
  cVar2 = QPixmap::isNull();
  if (cVar2 == '\0') {
    puVar3 = (undefined8 *)QPainter::worldTransform();
    puVar5 = local_78;
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    puVar3 = &DAT_006531e0;
    puVar5 = &local_c8;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar5 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
      puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
    }
    local_80 = 0;
    QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_c8,0));
    local_f8 = (double)(int)local_d0;
    dStack_f0 = (double)(int)((ulong)local_d0 >> 0x20);
    local_b8 = 0;
    uStack_b0 = 0;
    local_c8 = 0;
    uStack_c0 = 0;
    (**(code **)(**(long **)(lVar1 + 0xa8) + 0x68))
              (*(long **)(lVar1 + 0xa8),painter,&local_f8,local_e8,&local_c8);
    QPainter::setWorldTransform((QTransform *)painter,SUB81(local_78,0));
  }
  QPixmap::~QPixmap((QPixmap *)local_e8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00375043:
  __stack_chk_fail();
}

Assistant:

void QGraphicsDropShadowEffect::draw(QPainter *painter)
{
    Q_D(QGraphicsDropShadowEffect);
    if (d->filter->blurRadius() <= 0 && d->filter->offset().isNull()) {
        drawSource(painter);
        return;
    }

    PixmapPadMode mode = PadToEffectiveBoundingRect;

    // Draw pixmap in device coordinates to avoid pixmap scaling.
    QPoint offset;
    const QPixmap pixmap = sourcePixmap(Qt::DeviceCoordinates, &offset, mode);
    if (pixmap.isNull())
        return;

    QTransform restoreTransform = painter->worldTransform();
    painter->setWorldTransform(QTransform());
    d->filter->draw(painter, offset, pixmap);
    painter->setWorldTransform(restoreTransform);
}